

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# centroidtracker.cpp
# Opt level: O0

rowCol * __thiscall
centroidtracker::getRowsCols
          (centroidtracker *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *D)

{
  bool bVar1;
  value_type_conflict1 *__x;
  value_type_conflict1 *pvVar2;
  rowCol *in_RDI;
  int i;
  const_iterator iter;
  vector<int,_std::allocator<int>_> colResult;
  vector<int,_std::allocator<int>_> colTmp;
  vector<double,_std::allocator<double>_> minValue;
  vector<int,_std::allocator<int>_> rowResult;
  rowCol *result;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffeb8;
  rowCol *in_stack_fffffffffffffec0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffec8;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffed0;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffed8;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int iVar3;
  centroidtracker *in_stack_ffffffffffffff18;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff58;
  const_iterator in_stack_ffffffffffffff60;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_90;
  vector<double,_std::allocator<double>_> *local_88;
  __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  local_80 [4];
  vector<int,_std::allocator<int>_> local_60 [4];
  
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x13595b);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x135968);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x135975);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x135982);
  local_80[0]._M_current =
       (vector<double,_std::allocator<double>_> *)
       std::
       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ::begin((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)in_stack_fffffffffffffeb8);
  while( true ) {
    local_88 = (vector<double,_std::allocator<double>_> *)
               std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::end((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)in_stack_fffffffffffffeb8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                        *)in_stack_fffffffffffffec0,
                       (__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                        *)in_stack_fffffffffffffeb8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
    ::operator->(local_80);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffeb8);
    __gnu_cxx::
    __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
    ::operator->(local_80);
    in_stack_ffffffffffffff60 =
         std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffeb8);
    local_90 = std::
               min_element<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
                         (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator*(&local_90);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0._M_current,
               (value_type_conflict2 *)in_stack_fffffffffffffec8);
    in_stack_fffffffffffffed0._M_current = (double *)local_80;
    __gnu_cxx::
    __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
    ::operator->((__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                  *)in_stack_fffffffffffffed0._M_current);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffeb8);
    __gnu_cxx::
    __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
    ::operator->((__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                  *)in_stack_fffffffffffffed0._M_current);
    std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffeb8);
    in_stack_fffffffffffffed8 =
         std::
         min_element<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
                   (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    __gnu_cxx::
    __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
    ::operator->(local_80);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffeb8);
    __gnu_cxx::operator-
              ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffffec0,
               (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffffeb8);
    std::vector<int,_std::allocator<int>_>::push_back
              (&in_stack_fffffffffffffec0->rows,(value_type_conflict1 *)in_stack_fffffffffffffeb8);
    __gnu_cxx::
    __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
    ::operator++(local_80);
  }
  argsort(in_stack_ffffffffffffff18,
          (vector<double,_std::allocator<double>_> *)
          CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0._M_current,
             in_stack_fffffffffffffec8);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0._M_current);
  iVar3 = 0;
  while( true ) {
    __x = (value_type_conflict1 *)(long)iVar3;
    pvVar2 = (value_type_conflict1 *)std::vector<int,_std::allocator<int>_>::size(local_60);
    if (pvVar2 <= __x) break;
    in_stack_fffffffffffffec0 =
         (rowCol *)
         std::vector<int,_std::allocator<int>_>::at
                   (&in_stack_fffffffffffffec0->rows,(size_type)in_stack_fffffffffffffeb8);
    in_stack_fffffffffffffeb8 =
         (vector<double,_std::allocator<double>_> *)
         std::vector<int,_std::allocator<int>_>::at
                   ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0,
                    (size_type)in_stack_fffffffffffffeb8);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0._M_current,__x);
    iVar3 = iVar3 + 1;
  }
  rowCol::rowCol(in_stack_fffffffffffffec0);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff60._M_current,
             in_stack_ffffffffffffff58);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff60._M_current,
             in_stack_ffffffffffffff58);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0._M_current);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0._M_current);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0._M_current);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0._M_current);
  return in_RDI;
}

Assistant:

rowCol centroidtracker::getRowsCols(const std::vector<std::vector<double>> D) {
	std::vector<int> rowResult;
	std::vector<double> minValue;
	std::vector<int> colTmp;
	std::vector<int> colResult;
	for (auto iter = D.begin(); iter != D.end(); ++iter) {
		minValue.push_back(*std::min_element(iter->begin(), iter->end()));
		colTmp.push_back(std::min_element(iter->begin(), iter->end()) - iter->begin());
	}
	rowResult = argsort(minValue);

	for (int i = 0; i < colTmp.size(); ++i) {
		colResult.push_back(colTmp.at(rowResult.at(i)));
	}
	rowCol result;
	result.cols = colResult;
	result.rows = rowResult;

	return result;
}